

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_bilinear_apply_interpolation.h
# Opt level: O3

void ncnn::gridsample_3d_bilinear_apply_interpolation_p16
               (Mat *src,Mat *dst,Mat *offset_value,Option *opt)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  undefined1 (*pauVar7) [64];
  int *offset_ptr;
  int *piVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  
  iVar1 = dst->c;
  if (0 < (long)iVar1) {
    iVar3 = dst->h * dst->w * dst->d;
    lVar5 = 0;
    do {
      if (0 < iVar3) {
        lVar6 = src->cstep * lVar5 * src->elemsize;
        pvVar2 = src->data;
        piVar8 = (int *)offset_value->data;
        pauVar7 = (undefined1 (*) [64])(dst->cstep * lVar5 * dst->elemsize + (long)dst->data);
        iVar4 = iVar3;
        do {
          auVar10 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar11 = ZEXT1664(ZEXT816(0) << 0x40);
          if (-1 < (long)*piVar8) {
            auVar11 = *(undefined1 (*) [64])((long)pvVar2 + (long)*piVar8 * 4 + lVar6);
          }
          if (-1 < (long)piVar8[1]) {
            auVar10 = *(undefined1 (*) [64])((long)pvVar2 + (long)piVar8[1] * 4 + lVar6);
          }
          auVar12 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar14 = ZEXT1664(ZEXT816(0) << 0x40);
          if (-1 < (long)piVar8[2]) {
            auVar14 = *(undefined1 (*) [64])((long)pvVar2 + (long)piVar8[2] * 4 + lVar6);
          }
          if (-1 < (long)piVar8[3]) {
            auVar12 = *(undefined1 (*) [64])((long)pvVar2 + (long)piVar8[3] * 4 + lVar6);
          }
          auVar13 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar15 = ZEXT1664(ZEXT816(0) << 0x40);
          if (-1 < (long)piVar8[4]) {
            auVar15 = *(undefined1 (*) [64])((long)pvVar2 + (long)piVar8[4] * 4 + lVar6);
          }
          if (-1 < (long)piVar8[5]) {
            auVar13 = *(undefined1 (*) [64])((long)pvVar2 + (long)piVar8[5] * 4 + lVar6);
          }
          auVar17 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar16 = ZEXT1664(ZEXT816(0) << 0x40);
          if (-1 < (long)piVar8[6]) {
            auVar16 = *(undefined1 (*) [64])((long)pvVar2 + (long)piVar8[6] * 4 + lVar6);
          }
          if (-1 < (long)piVar8[7]) {
            auVar17 = *(undefined1 (*) [64])((long)pvVar2 + (long)piVar8[7] * 4 + lVar6);
          }
          auVar9 = vbroadcastss_avx512f(ZEXT416((uint)piVar8[8]));
          auVar11 = vfmsub231ps_avx512f(auVar11,auVar9,auVar11);
          auVar11 = vfmsub213ps_avx512f(auVar10,auVar9,auVar11);
          auVar10 = vfmsub231ps_avx512f(auVar14,auVar9,auVar14);
          auVar10 = vfnmadd213ps_avx512f(auVar12,auVar9,auVar10);
          auVar14 = vfmsub231ps_avx512f(auVar15,auVar9,auVar15);
          auVar14 = vfmsub213ps_avx512f(auVar13,auVar9,auVar14);
          auVar12 = vfmsub231ps_avx512f(auVar16,auVar9,auVar16);
          auVar12 = vfnmadd231ps_avx512f(auVar12,auVar9,auVar17);
          auVar15 = vbroadcastss_avx512f(ZEXT416((uint)piVar8[9]));
          auVar11 = vfmsub231ps_avx512f(auVar11,auVar15,auVar11);
          auVar11 = vfnmsub231ps_avx512f(auVar11,auVar15,auVar10);
          auVar10 = vfmsub231ps_avx512f(auVar14,auVar15,auVar14);
          auVar10 = vfmadd231ps_avx512f(auVar10,auVar15,auVar12);
          auVar14 = vbroadcastss_avx512f(ZEXT416((uint)piVar8[10]));
          auVar11 = vfmsub231ps_avx512f(auVar11,auVar14,auVar11);
          auVar11 = vfnmsub231ps_avx512f(auVar11,auVar14,auVar10);
          *pauVar7 = auVar11;
          pauVar7 = pauVar7 + 1;
          piVar8 = piVar8 + 0xb;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != iVar1);
  }
  return;
}

Assistant:

static void gridsample_3d_bilinear_apply_interpolation_p16(const Mat& src, Mat& dst, const Mat& offset_value, const Option& opt)
{
    const int channels = dst.c;
    const int outw = dst.w;
    const int outh = dst.h;
    const int outd = dst.d;
    const int grid_size = outw * outh * outd;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* srcptr = src.channel(q);
        float* dstptr = dst.channel(q);

        const float* offset_value_ptr = offset_value.channel(0);

        for (int i = 0; i < grid_size; i++)
        {
            const int* offset_ptr = (int*)offset_value_ptr;
            const float* value_ptr = offset_value_ptr + 8;

            __m512 v000_val = offset_ptr[0] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[0]) : _mm512_set1_ps(0);
            __m512 v001_val = offset_ptr[1] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[1]) : _mm512_set1_ps(0);
            __m512 v010_val = offset_ptr[2] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[2]) : _mm512_set1_ps(0);
            __m512 v011_val = offset_ptr[3] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[3]) : _mm512_set1_ps(0);

            __m512 v100_val = offset_ptr[4] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[4]) : _mm512_set1_ps(0);
            __m512 v101_val = offset_ptr[5] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[5]) : _mm512_set1_ps(0);
            __m512 v110_val = offset_ptr[6] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[6]) : _mm512_set1_ps(0);
            __m512 v111_val = offset_ptr[7] >= 0 ? _mm512_loadu_ps(srcptr + offset_ptr[7]) : _mm512_set1_ps(0);

            __m512 value = _mm512_set1_ps(value_ptr[0]);
            __m512 v00 = _mm512_fmadd_ps(v001_val, value, _mm512_fnmadd_ps(v000_val, value, v000_val));
            __m512 v01 = _mm512_fmadd_ps(v011_val, value, _mm512_fnmadd_ps(v010_val, value, v010_val));
            __m512 v10 = _mm512_fmadd_ps(v101_val, value, _mm512_fnmadd_ps(v100_val, value, v100_val));
            __m512 v11 = _mm512_fmadd_ps(v111_val, value, _mm512_fnmadd_ps(v110_val, value, v110_val));

            value = _mm512_set1_ps(value_ptr[1]);
            __m512 v0 = _mm512_fmadd_ps(v01, value, _mm512_fnmadd_ps(v00, value, v00));
            __m512 v1 = _mm512_fmadd_ps(v11, value, _mm512_fnmadd_ps(v10, value, v10));

            value = _mm512_set1_ps(value_ptr[2]);
            __m512 _v = _mm512_fmadd_ps(v1, value, _mm512_fnmadd_ps(v0, value, v0));
            _mm512_storeu_ps(dstptr, _v);

            dstptr += 16;
            offset_value_ptr += 11;
        }
    }
}